

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

void EndTextureMode(void)

{
  float16 result;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  rlDrawRenderBatch(RLGL.currentBatch);
  (*glad_glBindFramebuffer)(0x8d40,0);
  SetupViewport(CORE.Window.render.width,CORE.Window.render.height);
  RLGL.State.currentMatrix = &RLGL.State.modelview;
  RLGL.State.currentMatrixMode = 0x1700;
  RLGL.State.modelview.m0 = 1.0;
  RLGL.State.modelview.m4 = 0.0;
  RLGL.State.modelview.m8 = 0.0;
  RLGL.State.modelview.m12 = 0.0;
  RLGL.State.modelview.m1 = 0.0;
  RLGL.State.modelview.m5 = 1.0;
  RLGL.State.modelview.m9 = 0.0;
  RLGL.State.modelview.m13 = 0.0;
  RLGL.State.modelview.m2 = 0.0;
  RLGL.State.modelview.m6 = 0.0;
  RLGL.State.modelview.m10 = 1.0;
  RLGL.State.modelview.m14 = 0.0;
  RLGL.State.modelview.m3 = 0.0;
  RLGL.State.modelview.m7 = 0.0;
  RLGL.State.modelview.m11 = 0.0;
  _local_48 = CONCAT44(CORE.Window.screenScale.m1,CORE.Window.screenScale.m0);
  _fStack_40 = CONCAT44(CORE.Window.screenScale.m3,CORE.Window.screenScale.m2);
  _local_38 = CONCAT44(CORE.Window.screenScale.m5,CORE.Window.screenScale.m4);
  _fStack_30 = CONCAT44(CORE.Window.screenScale.m7,CORE.Window.screenScale.m6);
  _local_28 = CONCAT44(CORE.Window.screenScale.m9,CORE.Window.screenScale.m8);
  _fStack_20 = CONCAT44(CORE.Window.screenScale.m11,CORE.Window.screenScale.m10);
  _local_18 = CONCAT44(CORE.Window.screenScale.m13,CORE.Window.screenScale.m12);
  _fStack_10 = CONCAT44(CORE.Window.screenScale.m15,CORE.Window.screenScale.m14);
  RLGL.State.modelview.m15 = 1.0;
  rlMultMatrixf(&local_48);
  CORE.Window.currentFbo.height = CORE.Window.render.height;
  CORE.Window.currentFbo.width = CORE.Window.render.width;
  CORE.Window.usingFbo = false;
  return;
}

Assistant:

void EndTextureMode(void)
{
    rlDrawRenderBatchActive();      // Update and draw internal render batch

    rlDisableFramebuffer();         // Disable render target (fbo)

    // Set viewport to default framebuffer size
    SetupViewport(CORE.Window.render.width, CORE.Window.render.height);

    // Go back to the modelview state from BeginDrawing since we are back to the default FBO
    rlMatrixMode(RL_MODELVIEW);     // Switch back to modelview matrix
    rlLoadIdentity();               // Reset current matrix (modelview)
    rlMultMatrixf(MatrixToFloat(CORE.Window.screenScale)); // Apply screen scaling if required

    // Reset current fbo to screen size
    CORE.Window.currentFbo.width = CORE.Window.render.width;
    CORE.Window.currentFbo.height = CORE.Window.render.height;
    CORE.Window.usingFbo = false;
}